

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

int __thiscall
tetgenmesh::scoutpoint(tetgenmesh *this,point searchpt,triface *searchtet,int randflag)

{
  tetgenbehavior *ptVar1;
  tetrahedron ppdVar2;
  tetrahedron ppdVar3;
  tetrahedron ppdVar4;
  tetrahedron ppdVar5;
  locateresult lVar6;
  undefined4 extraout_EAX;
  uint uVar7;
  tetrahedron *pppdVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  int *piVar12;
  tetgenmesh *ptVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double local_a8;
  double dStack_a0;
  double local_68;
  double local_58;
  double local_48;
  
  if (randflag == 0) {
    if (searchtet->tet == (tetrahedron *)0x0) {
      searchtet->tet = (this->recenttet).tet;
      searchtet->ver = (this->recenttet).ver;
    }
  }
  else {
    randomsample(this,searchpt,searchtet);
  }
  ptVar13 = this;
  lVar6 = locate(this,searchpt,searchtet,0);
  if (lVar6 == OUTSIDE) {
    ptVar1 = this->b;
    if (ptVar1->convex != 0) {
      return 1;
    }
    pppdVar8 = searchtet->tet;
    uVar7 = searchtet->ver;
    ppdVar2 = pppdVar8[orgpivot[(int)uVar7]];
    ppdVar3 = pppdVar8[destpivot[(int)uVar7]];
    ppdVar4 = pppdVar8[apexpivot[(int)uVar7]];
    dVar14 = triarea(ptVar13,(double *)ppdVar2,(double *)ppdVar3,(double *)ppdVar4);
    local_68 = orient3dfast(ptVar13,(double *)ppdVar2,(double *)ppdVar3,(double *)ppdVar4,searchpt);
    local_58 = ptVar1->epsilon;
    if (ABS(local_68 / dVar14) < local_58) {
      ppdVar2 = pppdVar8[uVar7 & 3];
      uVar10 = (uint)ppdVar2 & 0xf;
      searchtet->ver = uVar10;
      pppdVar8 = (tetrahedron *)((ulong)ppdVar2 & 0xfffffffffffffff0);
      searchtet->tet = pppdVar8;
      iVar11 = fsymtbl[(int)uVar7][uVar10];
      searchtet->ver = iVar11;
      ptVar13 = (tetgenmesh *)searchtet;
      goto LAB_00123a4c;
    }
    memorypool::traversalinit(this->tetrahedrons);
    local_a8 = 0.0;
    dStack_a0 = 0.0;
    local_48 = 0.0;
    do {
      do {
        do {
          do {
            do {
              ptVar13 = this;
              pppdVar8 = tetrahedrontraverse(this);
              searchtet->tet = pppdVar8;
              if (pppdVar8 == (tetrahedron *)0x0) goto LAB_00123e39;
              iVar11 = searchtet->ver;
              ppdVar2 = pppdVar8[orgpivot[iVar11]];
              ppdVar3 = pppdVar8[destpivot[iVar11]];
              ppdVar4 = pppdVar8[apexpivot[iVar11]];
              ppdVar5 = pppdVar8[oppopivot[iVar11]];
              dVar14 = orient3dfast(ptVar13,(double *)ppdVar2,(double *)ppdVar3,(double *)ppdVar4,
                                    (double *)ppdVar5);
            } while (0.0 <= dVar14);
            local_68 = orient3dfast(ptVar13,(double *)ppdVar2,(double *)ppdVar3,(double *)ppdVar4,
                                    searchpt);
            dVar15 = this->b->epsilon;
            local_68 = (double)(~-(ulong)(ABS(local_68 / dVar14) < dVar15) & (ulong)local_68);
          } while (0.0 < local_68);
          dStack_a0 = orient3dfast(ptVar13,(double *)ppdVar3,(double *)ppdVar2,(double *)ppdVar5,
                                   searchpt);
          dStack_a0 = (double)(~-(ulong)(ABS(dStack_a0 / dVar14) < dVar15) & (ulong)dStack_a0);
        } while (0.0 < dStack_a0);
        local_a8 = orient3dfast(ptVar13,(double *)ppdVar4,(double *)ppdVar3,(double *)ppdVar5,
                                searchpt);
        local_a8 = (double)(~-(ulong)(ABS(local_a8 / dVar14) < dVar15) & (ulong)local_a8);
      } while (0.0 < local_a8);
      local_48 = orient3dfast(ptVar13,(double *)ppdVar2,(double *)ppdVar4,(double *)ppdVar5,searchpt
                             );
      local_48 = (double)(~-(ulong)(ABS(local_48 / dVar14) < dVar15) & (ulong)local_48);
    } while (0.0 < local_48);
LAB_00123e39:
    this->nonregularcount = this->nonregularcount + 1;
    if (pppdVar8 == (tetrahedron *)0x0) {
      return 1;
    }
  }
  else {
    pppdVar8 = searchtet->tet;
    iVar11 = searchtet->ver;
    local_58 = this->b->epsilon;
LAB_00123a4c:
    ppdVar2 = pppdVar8[orgpivot[iVar11]];
    ppdVar3 = pppdVar8[destpivot[iVar11]];
    ppdVar4 = pppdVar8[apexpivot[iVar11]];
    ppdVar5 = pppdVar8[oppopivot[iVar11]];
    dVar14 = orient3dfast(ptVar13,(double *)ppdVar2,(double *)ppdVar3,(double *)ppdVar4,
                          (double *)ppdVar5);
    dVar15 = orient3dfast(ptVar13,(double *)ppdVar2,(double *)ppdVar3,(double *)ppdVar4,searchpt);
    dStack_a0 = orient3dfast(ptVar13,(double *)ppdVar3,(double *)ppdVar2,(double *)ppdVar5,searchpt)
    ;
    local_a8 = orient3dfast(ptVar13,(double *)ppdVar4,(double *)ppdVar3,(double *)ppdVar5,searchpt);
    local_48 = orient3dfast(ptVar13,(double *)ppdVar2,(double *)ppdVar4,(double *)ppdVar5,searchpt);
    auVar20._8_8_ = dVar14;
    auVar20._0_8_ = dVar14;
    auVar19._8_8_ = dStack_a0;
    auVar19._0_8_ = local_a8;
    auVar20 = divpd(auVar19,auVar20);
    auVar16._8_8_ = dVar15;
    auVar16._0_8_ = local_48;
    auVar17._8_8_ = dVar14;
    auVar17._0_8_ = dVar14;
    auVar17 = divpd(auVar16,auVar17);
    auVar18._8_8_ = -(ulong)(ABS(auVar17._8_8_) < local_58);
    auVar18._0_8_ = -(ulong)(ABS(auVar17._0_8_) < local_58);
    uVar7 = movmskpd(extraout_EAX,auVar18);
    local_68 = 0.0;
    if ((uVar7 & 2) == 0) {
      local_68 = dVar15;
    }
    local_a8 = (double)(-(ulong)(local_58 <= ABS(auVar20._0_8_)) & (ulong)local_a8);
    dStack_a0 = (double)(-(ulong)(local_58 <= ABS(auVar20._8_8_)) & (ulong)dStack_a0);
    if ((uVar7 & 1) != 0) {
      local_48 = 0.0;
    }
  }
  if ((local_68 != 0.0) || (NAN(local_68))) {
    if ((dStack_a0 != 0.0) || (NAN(dStack_a0))) {
      if ((local_a8 != 0.0) || (NAN(local_a8))) {
        if ((local_48 == 0.0) && (!NAN(local_48))) {
          iVar11 = eprevtbl[searchtet->ver];
          searchtet->ver = iVar11;
          searchtet->ver = esymtbl[iVar11];
          return 3;
        }
        return 2;
      }
      iVar11 = enexttbl[searchtet->ver];
      searchtet->ver = iVar11;
      iVar11 = esymtbl[iVar11];
      searchtet->ver = iVar11;
      if (local_48 != 0.0) {
        return 3;
      }
      if (NAN(local_48)) {
        return 3;
      }
LAB_00123eb2:
      lVar9 = (long)iVar11;
      piVar12 = eprevtbl;
    }
    else {
      lVar9 = (long)esymtbl[searchtet->ver];
      searchtet->ver = esymtbl[searchtet->ver];
      if ((local_a8 == 0.0) && (!NAN(local_a8))) {
        searchtet->ver = eprevtbl[lVar9];
        goto LAB_00123be7;
      }
      if (local_48 != 0.0) {
        return 3;
      }
      if (NAN(local_48)) {
        return 3;
      }
LAB_00123e9d:
      piVar12 = enexttbl;
    }
    searchtet->ver = piVar12[lVar9];
    iVar11 = 4;
  }
  else {
    if ((dStack_a0 != 0.0) || (NAN(dStack_a0))) {
      if ((local_a8 != 0.0) || (NAN(local_a8))) {
        if (local_48 != 0.0) {
          return 3;
        }
        if (NAN(local_48)) {
          return 3;
        }
        iVar11 = searchtet->ver;
        goto LAB_00123eb2;
      }
      lVar9 = (long)searchtet->ver;
      if ((local_48 != 0.0) || (NAN(local_48))) goto LAB_00123e9d;
      piVar12 = eprevtbl;
    }
    else {
      if ((local_a8 != 0.0) || (NAN(local_a8))) {
LAB_00123be7:
        return (local_48 == 0.0) + 4;
      }
      lVar9 = (long)searchtet->ver;
      piVar12 = enexttbl;
    }
    searchtet->ver = piVar12[lVar9];
    iVar11 = 5;
  }
  return iVar11;
}

Assistant:

int tetgenmesh::scoutpoint(point searchpt, triface *searchtet, int randflag)
{
  point pa, pb, pc, pd;
  enum locateresult loc = OUTSIDE;
  REAL vol, ori1, ori2 = 0, ori3 = 0, ori4 = 0;
  int t1ver;


  // Randomly select a good starting tet.
  if (randflag) {
    randomsample(searchpt, searchtet);
  } else {
    if (searchtet->tet == NULL) {
      *searchtet = recenttet;
    }
  }
  loc = locate(searchpt, searchtet);

  if (loc == OUTSIDE) {
    if (b->convex) { // -c option
      // The point lies outside of the convex hull.
      return (int) loc;
    }
    // Test if it lies nearly on the hull face.
    // Reuse vol, ori1.
    pa = org(*searchtet);
    pb = dest(*searchtet);
    pc = apex(*searchtet);
    vol = triarea(pa, pb, pc);
    ori1 = orient3dfast(pa, pb, pc, searchpt);
    if (fabs(ori1 / vol) < b->epsilon) {
      loc = ONFACE; // On face (or on edge, or on vertex).
      fsymself(*searchtet);
    }
  }

  if (loc != OUTSIDE) {
    // Round the result of location.
    pa = org(*searchtet);
    pb = dest(*searchtet);
    pc = apex(*searchtet);
    pd = oppo(*searchtet);
    vol = orient3dfast(pa, pb, pc, pd);
    ori1 = orient3dfast(pa, pb, pc, searchpt);
    ori2 = orient3dfast(pb, pa, pd, searchpt);
    ori3 = orient3dfast(pc, pb, pd, searchpt);
    ori4 = orient3dfast(pa, pc, pd, searchpt);
    if (fabs(ori1 / vol) < b->epsilon) ori1 = 0;
    if (fabs(ori2 / vol) < b->epsilon) ori2 = 0;
    if (fabs(ori3 / vol) < b->epsilon) ori3 = 0;
    if (fabs(ori4 / vol) < b->epsilon) ori4 = 0;
  } else { // if (loc == OUTSIDE) {
    // Do a brute force search for the point (with rounding).
    tetrahedrons->traversalinit();
    searchtet->tet = tetrahedrontraverse();
    while (searchtet->tet != NULL) {
      pa = org(*searchtet);
      pb = dest(*searchtet);
      pc = apex(*searchtet);
      pd = oppo(*searchtet);

      vol = orient3dfast(pa, pb, pc, pd); 
      if (vol < 0) {
        ori1 = orient3dfast(pa, pb, pc, searchpt);
        if (fabs(ori1 / vol) < b->epsilon) ori1 = 0; // Rounding.
        if (ori1 <= 0) {
          ori2 = orient3dfast(pb, pa, pd, searchpt);
          if (fabs(ori2 / vol) < b->epsilon) ori2 = 0;
          if (ori2 <= 0) {
            ori3 = orient3dfast(pc, pb, pd, searchpt);
            if (fabs(ori3 / vol) < b->epsilon) ori3 = 0;
            if (ori3 <= 0) {
              ori4 = orient3dfast(pa, pc, pd, searchpt);
              if (fabs(ori4 / vol) < b->epsilon) ori4 = 0;
              if (ori4 <= 0) {
                // Found the tet. Return its location. 
                break;
              } // ori4
            } // ori3
          } // ori2
        } // ori1
      }

      searchtet->tet = tetrahedrontraverse();
    } // while (searchtet->tet != NULL)
    nonregularcount++;  // Re-use this counter.
  }

  if (searchtet->tet != NULL) {
    // Return the point location.
    if (ori1 == 0) { // on face [a,b,c]
      if (ori2 == 0) { // on edge [a,b].
        if (ori3 == 0) { // on vertex [b].
          enextself(*searchtet); // [b,c,a,d]
          loc = ONVERTEX;
        } else {
          if (ori4 == 0) { // on vertex [a]
            loc =  ONVERTEX; // [a,b,c,d]
          } else {    
            loc =  ONEDGE; // [a,b,c,d]
          }
        }
      } else { // ori2 != 0
        if (ori3 == 0) { // on edge [b,c]
          if (ori4 == 0) { // on vertex [c]
            eprevself(*searchtet); // [c,a,b,d]
            loc =  ONVERTEX;
          } else {
            enextself(*searchtet); // [b,c,a,d]
            loc =  ONEDGE;
          }
        } else { // ori3 != 0
          if (ori4 == 0) { // on edge [c,a]
            eprevself(*searchtet); // [c,a,b,d]
            loc =  ONEDGE;
          } else {
            loc =  ONFACE;
          }
        }
      }
    } else { // ori1 != 0
      if (ori2 == 0) { // on face [b,a,d]
        esymself(*searchtet); // [b,a,d,c]
        if (ori3 == 0) { // on edge [b,d]
          eprevself(*searchtet); // [d,b,a,c]
          if (ori4 == 0) { // on vertex [d]                      
            loc =  ONVERTEX;
          } else {
            loc =  ONEDGE;
          }
        } else { // ori3 != 0
          if (ori4 == 0) { // on edge [a,d]
            enextself(*searchtet); // [a,d,b,c]
            loc =  ONEDGE;
          } else {
            loc =  ONFACE;
          }
        }
      } else { // ori2 != 0
        if (ori3 == 0) { // on face [c,b,d]
          enextself(*searchtet);
          esymself(*searchtet);
          if (ori4 == 0) { // on edge [c,d]
            eprevself(*searchtet);
            loc =  ONEDGE;
          } else {
            loc =  ONFACE;
          }
        } else {
          if (ori4 == 0) { // on face [a,c,d]
            eprevself(*searchtet);
            esymself(*searchtet);
            loc =  ONFACE;
          } else { // inside tet [a,b,c,d]
            loc =  INTETRAHEDRON;
          } // ori4
        } // ori3
      } // ori2
    } // ori1
  } else {
    loc = OUTSIDE;
  }

  return (int) loc;
}